

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderBeamIGA::BuildBeam
          (ChBuilderBeamIGA *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,ChLineBspline *spline,
          ChVector<double> *Ydir)

{
  uint uVar1;
  ChMesh *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ChNodeFEAxyzrot *this_00;
  pointer pCVar11;
  double *__args;
  ChVector<double> *mv;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 in_XMM11_Qa;
  undefined8 in_XMM11_Qb;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> hnode_i;
  ChMatrix33<double> mrot;
  ChVector<double> tangent;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  mynodes;
  ChVector<double> pos;
  vector<double,_std::allocator<double>_> my_el_knots;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  my_el_nodes;
  long local_2b0;
  value_type local_298;
  ulong local_288;
  shared_ptr<chrono::fea::ChMesh> *local_280;
  ulong local_278;
  undefined8 uStack_270;
  element_type *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  ChMatrix33<double> local_258;
  shared_ptr<chrono::fea::ChElementBase> local_208;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_1f8;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_1c8;
  ulong local_1a8;
  ChBuilderBeamIGA *local_1a0;
  shared_ptr<chrono::fea::ChBeamSectionCosserat> *local_198;
  vector<double,_std::allocator<double>_> local_190;
  ChVector<double> local_178;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_160;
  ChFrame<double> local_148;
  ChFrame<double> local_b8;
  
  local_280 = mesh;
  local_198 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ::clear(&this->beam_elems);
  local_1a0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(&this->beam_nodes);
  uVar1 = spline->p;
  local_288 = (ulong)(uVar1 * 2);
  uVar8 = ~(uVar1 * 2) +
          (int)(spline->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
  local_1c8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar11 = (spline->points).
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(spline->points).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11;
  if (lVar9 != 0) {
    lVar14 = 0x10;
    uVar12 = 0;
    uVar10 = (lVar9 >> 3) * -0x5555555555555555;
    local_278 = 0x8000000000000000;
    uStack_270 = 0x8000000000000000;
    do {
      local_178.m_data[0] = *(double *)((long)pCVar11->m_data + lVar14 + -0x10);
      local_178.m_data[1] = *(double *)((long)pCVar11->m_data + lVar14 + -8);
      local_178.m_data[2] = *(double *)((long)pCVar11->m_data + lVar14);
      local_1d8 = 0.0;
      auVar18._8_8_ = in_XMM11_Qb;
      auVar18._0_8_ = in_XMM11_Qa;
      vcvtusi2sd_avx512f(auVar18,uVar10 - 1);
      local_1e8 = 0.0;
      dStack_1e0 = 0.0;
      (*(spline->super_ChLine).super_ChGeometry._vptr_ChGeometry[0xc])(spline,&local_1e8);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_1e8;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_1d8;
      auVar16 = ZEXT816(0) << 0x40;
      if ((((local_1e8 != 0.0) || (NAN(local_1e8))) || (dStack_1e0 != 0.0)) || (NAN(dStack_1e0))) {
LAB_005e2566:
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dStack_1e0 * dStack_1e0;
        auVar18 = vfmadd231sd_fma(auVar19,auVar21,auVar21);
        auVar18 = vfmadd231sd_fma(auVar18,auVar28,auVar28);
        auVar18 = vsqrtsd_avx(auVar18,auVar18);
        dVar20 = 1.0 / auVar18._0_8_;
        bVar6 = 2.2250738585072014e-308 <= auVar18._0_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = (ulong)bVar6 * (long)(local_1d8 * dVar20);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = (ulong)bVar6 * (long)(dStack_1e0 * dVar20);
        auVar17._0_8_ =
             (ulong)bVar6 * (long)(local_1e8 * dVar20) + (ulong)!bVar6 * 0x3ff0000000000000;
        auVar17._8_8_ = 0;
      }
      else {
        auVar17 = ZEXT816(0x3ff0000000000000);
        auVar15 = ZEXT816(0) << 0x40;
        if ((local_1d8 != 0.0) || (NAN(local_1d8))) goto LAB_005e2566;
      }
      auVar25._8_8_ = 0;
      auVar25._0_8_ = Ydir->m_data[2];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = Ydir->m_data[0];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = Ydir->m_data[1];
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           auVar17._0_8_;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           auVar15._0_8_;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           auVar16._0_8_;
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           Ydir->m_data[2] *
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar18 = vfmsub231sd_fma(auVar29,auVar15,auVar32);
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           Ydir->m_data[1] *
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar21 = vfmsub231sd_fma(auVar22,auVar16,auVar25);
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           auVar21._0_8_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           Ydir->m_data[0] *
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar28 = vfmsub231sd_fma(auVar34,auVar17,auVar37);
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           auVar28._0_8_;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           auVar18._0_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar18 = vfmadd231sd_fma(auVar39,auVar21,auVar21);
      auVar18 = vfmadd231sd_fma(auVar18,auVar28,auVar28);
      auVar18 = vsqrtsd_avx(auVar18,auVar18);
      dVar20 = auVar18._0_8_;
      if (dVar20 < 0.0001) {
        auVar3._8_8_ = 0x7fffffffffffffff;
        auVar3._0_8_ = 0x7fffffffffffffff;
        auVar18 = vandpd_avx512vl(auVar32,auVar3);
        auVar19 = ZEXT816(0x3ff0000000000000);
        auVar21 = ZEXT816(0) << 0x40;
        auVar28 = ZEXT816(0);
        if (0.9 <= auVar18._0_8_) {
          auVar4._8_8_ = 0x7fffffffffffffff;
          auVar4._0_8_ = 0x7fffffffffffffff;
          auVar18 = vandpd_avx512vl(auVar37,auVar4);
          auVar19 = ZEXT816(0);
          auVar28 = ZEXT816(0x3ff0000000000000);
          if (0.9 <= auVar18._0_8_) {
            auVar5._8_8_ = 0x7fffffffffffffff;
            auVar5._0_8_ = 0x7fffffffffffffff;
            auVar18 = vandpd_avx512vl(auVar25,auVar5);
            auVar28 = ZEXT816(0);
            if (auVar18._0_8_ < 0.9) {
              auVar21 = ZEXT816(0x3ff0000000000000);
            }
          }
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ =
             auVar28._0_8_ *
             (double)(local_278 ^
                     (ulong)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[6]);
        auVar18 = vfmadd231sd_fma(auVar23,auVar16,auVar21);
        local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             auVar18._0_8_;
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             auVar21._0_8_ *
             (double)(local_278 ^
                     (ulong)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0]);
        auVar21 = vfmadd231sd_fma(auVar30,auVar15,auVar19);
        auVar35._8_8_ = 0;
        auVar35._0_8_ =
             (double)(local_278 ^
                     (ulong)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[3]) * auVar19._0_8_;
        auVar28 = vfmadd231sd_fma(auVar35,auVar17,auVar28);
        local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
             auVar28._0_8_;
        local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
             auVar21._0_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ =
             local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
             * local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
        auVar18 = vfmadd231sd_fma(auVar26,auVar18,auVar18);
        auVar18 = vfmadd231sd_fma(auVar18,auVar28,auVar28);
        auVar18 = vsqrtsd_avx(auVar18,auVar18);
        dVar20 = auVar18._0_8_;
      }
      dVar20 = 1.0 / dVar20;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
           dVar20;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
           dVar20;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           dVar20;
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar33._8_8_ = 0;
      auVar33._0_8_ =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar18 = vfmsub231sd_fma(auVar33,auVar31,auVar15);
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar36._8_8_ = 0;
      auVar36._0_8_ =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar21 = vfmsub231sd_fma(auVar36,auVar27,auVar17);
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar38._8_8_ = 0;
      auVar38._0_8_ =
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar16 = vfmsub231sd_fma(auVar38,auVar24,auVar16);
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           auVar18._0_8_;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           auVar21._0_8_;
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           auVar16._0_8_;
      mv = &local_178;
      ChFrame<double>::ChFrame(&local_b8,mv,&local_258);
      this_00 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
      local_148._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
      local_148.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
      local_148.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
      local_148.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
      local_148.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
      local_148.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
      local_148.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
      local_148.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_00,&local_148);
      local_298.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                (&local_298.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_00);
      pCVar2 = (local_280->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(local_298.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_ChNodeFEAbase;
      local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_298.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_298.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_298.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_298.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_298.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_298.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar2,&local_1f8);
      if (local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(&local_1c8,&local_298);
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(&this->beam_nodes,&local_298);
      if (local_298.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_298.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pCVar11 = (spline->points).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + 0x18;
      uVar10 = ((long)(spline->points).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11 >> 3) *
               -0x5555555555555555;
    } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
  }
  if (0 < (int)uVar8) {
    local_2b0 = 0;
    local_278 = 0;
    uVar10 = 0;
    iVar7 = (int)local_288;
    local_1a8 = (ulong)(uVar1 + 1);
    do {
      local_148.coord.pos.m_data[1] = 0.0;
      local_148._vptr_ChFrame = (_func_int **)0x0;
      local_148.coord.pos.m_data[0] = 0.0;
      if (-2 < (int)local_288) {
        uVar13 = 0;
        uVar12 = local_278;
        do {
          if ((spline->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= (long)(uVar10 + uVar13)) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          __args = (double *)
                   ((long)(spline->knots).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + uVar12);
          if (local_148.coord.pos.m_data[0] == local_148.coord.pos.m_data[1]) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_148,
                       (iterator)local_148.coord.pos.m_data[0],__args);
          }
          else {
            *(double *)local_148.coord.pos.m_data[0] = *__args;
            local_148.coord.pos.m_data[0] = (double)((long)local_148.coord.pos.m_data[0] + 8);
          }
          uVar13 = uVar13 + 1;
          uVar12 = uVar12 + 8;
        } while (iVar7 + 2 != uVar13);
      }
      local_b8.coord.pos.m_data[1] = 0.0;
      local_b8._vptr_ChFrame = (_func_int **)0x0;
      local_b8.coord.pos.m_data[0] = 0.0;
      lVar9 = local_2b0;
      uVar12 = local_1a8;
      if (-1 < (int)uVar1) {
        do {
          std::
          vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       *)&local_b8,
                      (value_type *)
                      ((long)&((local_1c8.
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + lVar9));
          lVar9 = lVar9 + 0x10;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamIGA,std::allocator<chrono::fea::ChElementBeamIGA>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 1),(ChElementBeamIGA **)&local_258,
                 (allocator<chrono::fea::ChElementBeamIGA> *)&local_178);
      dVar20 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::vector(&local_160,
               (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                *)&local_b8);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_190,(vector<double,_std::allocator<double>_> *)&local_148);
      (*(*(_func_int ***)dVar20)[0x1c])(dVar20,&local_160,&local_190,(ulong)uVar1);
      if (local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector(&local_160);
      local_268 = (local_198->
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_260._M_pi =
           (local_198->
           super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
        }
      }
      ((element_type *)
      ((long)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
      + 0x188))->_vptr_ChElementBase = (_func_int **)local_268;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[0] + 400),&local_260);
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
      }
      pCVar2 = (local_280->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_208.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_208.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] + 8) =
               *(_Atomic_word *)
                ((long)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] + 8) =
               *(_Atomic_word *)
                ((long)local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar2,&local_208);
      if (local_208.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
      ::push_back(&local_1a0->beam_elems,(value_type *)&local_258);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1]);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 *)&local_b8);
      if (local_148._vptr_ChFrame != (_func_int **)0x0) {
        operator_delete(local_148._vptr_ChFrame,
                        (long)local_148.coord.pos.m_data[1] - (long)local_148._vptr_ChFrame);
      }
      local_278 = local_278 + 8;
      local_2b0 = local_2b0 + 0x10;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar8);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

void ChBuilderBeamIGA::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                 std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                 geometry::ChLineBspline& spline,  // the B-spline to be used as the centerline
                                 const ChVector<> Ydir             // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    int p = spline.GetOrder();

    // compute N of spans (excluding start and end multiple knots with zero lenght span):
    int N = (int)spline.Knots().size() - p - p - 1;  // = n+p+1 -p-p-1 = n-p

    // Create the 'complete' stl vector of control points, with uniform distribution
    std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes;
    for (int i_node = 0; i_node < spline.Points().size(); ++i_node) {
        double abscyssa = ((double)i_node / (double)(spline.Points().size() - 1));

        // position of node
        ChVector<> pos = spline.Points()[i_node];

        // rotation of node, x aligned to tangent at input spline
        ChMatrix33<> mrot;
        ChVector<> tangent;
        spline.Derive(tangent, abscyssa);
        mrot.Set_A_Xdir(tangent, Ydir);

        auto hnode_i = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(hnode_i);
        mynodes.push_back(hnode_i);
        this->beam_nodes.push_back(hnode_i);
    }

    // Create the single elements by picking a subset of the nodes and control points
    for (int i_el = 0; i_el < N; ++i_el) {
        std::vector<double> my_el_knots;
        for (int i_el_knot = 0; i_el_knot < p + p + 1 + 1; ++i_el_knot) {
            my_el_knots.push_back(spline.Knots()(i_el + i_el_knot));
        }

        std::vector<std::shared_ptr<ChNodeFEAxyzrot>> my_el_nodes;
        for (int i_el_node = 0; i_el_node < p + 1; ++i_el_node) {
            my_el_nodes.push_back(mynodes[i_el + i_el_node]);
        }

        auto belement_i = chrono_types::make_shared<ChElementBeamIGA>();
        belement_i->SetNodesGenericOrder(my_el_nodes, my_el_knots, p);
        belement_i->SetSection(sect);
        mesh->AddElement(belement_i);
        this->beam_elems.push_back(belement_i);
    }
}